

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::absolute_pose::modules::upnp_main
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  pointer ppVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  int q;
  long lVar7;
  Matrix<double,_4,_1,_0,_4,_1> *pMVar8;
  const_iterator __position;
  complex<double> *pcVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 extraout_var [56];
  double dVar13;
  double dVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [64];
  Matrix<double,_1,_1,_0,_1,_1> valueM;
  Vector4d quaternion;
  Matrix<double,_10,_1,_0,_10,_1> s;
  Matrix<std::complex<double>,_16,_16,_0,_16,_16> V;
  Matrix<double,_16,_16,_0,_16,_16> Action;
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> Eig;
  double local_4508;
  Vector4d local_4500;
  undefined1 local_44e0 [16];
  Matrix<double,_10,_1,_0,_10,_1> *local_44d0;
  double local_44c0;
  double dStack_44b8;
  Matrix<double,_1,_10,_1,_1,_10> *pMStack_44b0;
  double dStack_44a8;
  Matrix<double,_10,_1,_0,_10,_1> *local_44a0;
  Matrix<double,_10,_1,_0,_10,_1> local_4490;
  EigenvectorsType local_4440;
  EigenBase<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> local_3440 [2048];
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> local_2c40;
  
  upnp::setupAction_gj(M,C,gamma,(Matrix<double,_16,_16,_0,_16,_16> *)local_3440);
  Eigen::EigenSolver<Eigen::Matrix<double,16,16,0,16,16>>::
  EigenSolver<Eigen::Matrix<double,16,16,0,16,16>>
            ((EigenSolver<Eigen::Matrix<double,16,16,0,16,16>> *)&local_2c40,local_3440,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_>::eigenvectors
            (&local_4440,&local_2c40);
  pcVar9 = local_4440.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_16,_0,_16,_16>_>
           .m_storage.m_data.array + 0xb;
  auVar16 = ZEXT864(0) << 0x40;
  lVar10 = 0;
  do {
    if (lVar10 == 0x10) {
      return;
    }
    auVar12 = ZEXT864(0) << 0x40;
    for (lVar7 = 0; dVar13 = auVar12._0_8_, lVar7 != 0x20; lVar7 = lVar7 + 8) {
      dVar15 = *(double *)(pcVar9->_M_value + lVar7 * 2);
      *(double *)
       ((long)local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array + lVar7) = dVar15;
      auVar12 = ZEXT864((ulong)(dVar13 + dVar15 * dVar15));
    }
    if (dVar13 < 0.0) {
      auVar16._0_8_ = sqrt(dVar13);
      auVar16._8_56_ = extraout_var;
      auVar14 = auVar16._0_16_;
      auVar16 = ZEXT864(0) << 0x40;
    }
    else {
      auVar14 = vsqrtsd_avx(auVar12._0_16_,auVar12._0_16_);
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[0];
    uVar3 = vcmpsd_avx512f(auVar16._0_16_,auVar11,0xe);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar14,auVar5);
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [lVar7] = local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[lVar7] /
                (double)((ulong)bVar4 * auVar11._0_8_ + (ulong)!bVar4 * auVar14._0_8_);
    }
    ppVar1 = (quaternions->
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    auVar6._8_8_ = local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                   .m_data.array[1];
    auVar6._0_8_ = local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                   .m_data.array[0];
    auVar6._16_8_ =
         local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[2];
    auVar6._24_8_ =
         local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[3];
    pMVar8 = &ppVar1->second;
    lVar7 = ((long)(quaternions->
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6) + 1;
    while (lVar7 = lVar7 + -1, lVar7 != 0) {
      auVar2 = vsubpd_avx(auVar6,(undefined1  [32])
                                 (pMVar8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                                 m_storage.m_data);
      pMVar8 = pMVar8 + 2;
      dVar13 = auVar2._0_8_ * auVar2._0_8_ + auVar2._16_8_ * auVar2._16_8_;
      dVar15 = auVar2._8_8_ * auVar2._8_8_ + auVar2._24_8_ * auVar2._24_8_;
      auVar14._0_8_ = dVar13 + dVar15;
      auVar14._8_8_ = dVar13 + dVar15;
      auVar14 = vsqrtsd_avx(auVar14,auVar14);
      if (auVar14._0_8_ < 1e-08) goto LAB_0020dce8;
    }
    upnp_fill_s(&local_4500,&local_4490);
    dStack_44b8 = 2.0;
    local_44e0._0_8_ = &local_4490;
    local_44e0._8_8_ = M;
    local_44d0 = &local_4490;
    pMStack_44b0 = C;
    local_44a0 = &local_4490;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>const>const,Eigen::Matrix<double,1,10,1,1,10>const>,Eigen::Matrix<double,10,1,0,10,1>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>> *)&local_4508,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>_>
                *)local_44e0);
    local_44e0._0_8_ = gamma + local_4508;
    for (__position._M_current =
              (quaternions->
              super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        (__position._M_current !=
         (quaternions->
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish &&
        ((__position._M_current)->first < (double)local_44e0._0_8_));
        __position._M_current = __position._M_current + 1) {
    }
    local_44c0 = local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                 m_data.array[0];
    dStack_44b8 = local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[1];
    pMStack_44b0 = (Matrix<double,_1,_10,_1,_1,_10> *)
                   local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                   .m_data.array[2];
    dStack_44a8 = local_4500.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[3];
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::_M_insert_rval(quaternions,__position,(value_type *)local_44e0);
    auVar16 = ZEXT864(0) << 0x40;
LAB_0020dce8:
    lVar10 = lVar10 + 1;
    pcVar9 = pcVar9 + 0x10;
  } while( true );
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,16,16> Action;
  upnp::setupAction_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,16,16> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,16,16> V = Eig.eigenvectors();
  
  //cut the double solutions
  double doubleSolThreshold = 0.00000001;
  
  for( int i = 0; i < 16; i++ )
  {
    //we decided to drop the test for imaginary part
    //I've noticed that when the number of points is really low, things get a little
    //weary with noise, and complex solutions might actually be pretty good
    
    Eigen::Vector4d quaternion;
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
    {
      quaternion[q] = V(11+q,i).real();
      norm += pow(quaternion[q],2.0);
    }
    norm = sqrt(norm);
    if(quaternion[0] < 0) // this here is maybe risky, what if quaternion[0] is very small
      norm *= -1.0;
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    bool alreadyThere = false;
    for( size_t s = 0; s < quaternions.size(); s++ )
    {
      Eigen::Vector4d diff = quaternion - quaternions[s].second;
      if( diff.norm() < doubleSolThreshold )
      {
        alreadyThere = true;
        break;
      }
    }
    
    if( !alreadyThere )
    {
      Eigen::Matrix<double,10,1> s;
      upnp_fill_s(quaternion,s);
      Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
      double value = valueM[0] + gamma;
      
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
}